

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.cpp
# Opt level: O3

string * __thiscall
StringTools::generateRandomString_abi_cxx11_
          (string *__return_storage_ptr__,StringTools *this,size_t length)

{
  int iVar1;
  
  if (generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_);
    if (iVar1 != 0) {
      generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_._M_dataplus._M_p =
           (pointer)&generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_,
                 "qwertyuiopasdfghjklzxcvbnmQWERTYUIOPASDFGHJKLZXCVBNM1234567890-=[]\\;\',./!@#$%^&*()_+{}|:\"<>?`~"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_);
    }
  }
  if (generateRandomString[abi:cxx11](unsigned_long)::charsLen == '\0') {
    generateRandomString_abi_cxx11_();
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (StringTools *)0x0) {
    do {
      rand();
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      this = this + -1;
    } while (this != (StringTools *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

string generateRandomString(size_t length) {
    static const string chars("qwertyuiopasdfghjklzxcvbnmQWERTYUIOPASDFGHJKLZXCVBNM1234567890-=[]\\;',./!@#$%^&*()_+{}|:\"<>?`~");
    static const size_t charsLen = chars.length();
    string result;
    for (size_t i = 0; i < length; ++i) {
        result += chars[rand() % charsLen];
    }
    return result;
}